

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_map.h
# Opt level: O0

void __thiscall cppcms::impl::string_pool::add_page(string_pool *this)

{
  long *plVar1;
  bad_alloc *this_00;
  long *in_RDI;
  page *p;
  
  plVar1 = (long *)malloc(*in_RDI + 0x10);
  if (plVar1 == (long *)0x0) {
    this_00 = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this_00);
    __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  *plVar1 = in_RDI[1];
  in_RDI[1] = (long)plVar1;
  in_RDI[3] = (long)(plVar1 + 1);
  in_RDI[2] = *in_RDI;
  return;
}

Assistant:

void add_page()
			{
				page *p=(page *)malloc(sizeof(page) + page_size_);
				if(!p)
					throw std::bad_alloc();
				p->next = pages_;
				pages_ = p;
				data_ = p->data;
				free_space_ = page_size_;
			}